

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

Span * __thiscall QSpanCollection::spanAt(QSpanCollection *this,int x,int y)

{
  _Rb_tree_color _Var1;
  QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
  *pQVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  
  pQVar2 = (this->index).d.d.ptr;
  if (pQVar2 == (QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
                 *)0x0) {
    p_Var3 = (_Base_ptr)0x0;
  }
  else {
    p_Var4 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
    p_Var3 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var4 != (_Base_ptr)0x0) {
      do {
        _Var1 = p_Var4[1]._M_color;
        bVar6 = (int)(_Var1 + y) < 0;
        if (SBORROW4(_Var1,-y) == bVar6) {
          p_Var3 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[SBORROW4(_Var1,-y) != bVar6];
      } while (p_Var4 != (_Base_ptr)0x0);
    }
  }
  p_Var4 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar2 == (QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
                 *)0x0) {
    p_Var4 = (_Base_ptr)0x0;
  }
  if (p_Var3 != p_Var4) {
    p_Var3 = p_Var3[1]._M_parent;
    if (p_Var3 == (_Base_ptr)0x0) {
      p_Var4 = (_Base_ptr)0x0;
    }
    else {
      p_Var5 = p_Var3->_M_right;
      p_Var4 = (_Base_ptr)&p_Var3->_M_left;
      if (p_Var5 != (_Base_ptr)0x0) {
        do {
          _Var1 = p_Var5[1]._M_color;
          bVar6 = (int)(_Var1 + x) < 0;
          if (SBORROW4(_Var1,-x) == bVar6) {
            p_Var4 = p_Var5;
          }
          p_Var5 = (&p_Var5->_M_left)[SBORROW4(_Var1,-x) != bVar6];
        } while (p_Var5 != (_Base_ptr)0x0);
      }
    }
    p_Var5 = (_Base_ptr)&p_Var3->_M_left;
    if (p_Var3 == (_Base_ptr)0x0) {
      p_Var5 = (_Base_ptr)0x0;
    }
    if (((p_Var4 != p_Var5) &&
        (p_Var3 = p_Var4[1]._M_parent, x <= *(int *)((long)&p_Var3->_M_parent + 4))) &&
       (y <= *(int *)&p_Var3->_M_parent)) {
      return (Span *)p_Var3;
    }
  }
  return (Span *)(_Base_ptr)0x0;
}

Assistant:

constexpr P get() const noexcept { return ptr; }